

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNames
          (Parser *this,EnumDescriptorProto *message,LocationRecorder *parent_location)

{
  int iVar1;
  Rep *pRVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *obj;
  string *output;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  do {
    LocationRecorder::LocationRecorder
              (&LStack_48,parent_location,
               (message->reserved_name_).super_RepeatedPtrFieldBase.current_size_);
    pRVar2 = (message->reserved_name_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar2 == (Rep *)0x0) {
LAB_00345f50:
      obj = Arena::Create<std::__cxx11::string>
                      ((message->reserved_name_).super_RepeatedPtrFieldBase.arena_);
      output = (string *)
               internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                         (&(message->reserved_name_).super_RepeatedPtrFieldBase,obj);
    }
    else {
      iVar1 = (message->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
      if (pRVar2->allocated_size <= iVar1) goto LAB_00345f50;
      (message->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      output = (string *)pRVar2->elements[iVar1];
    }
    bVar3 = ConsumeString(this,output,"Expected enum value.");
    LocationRecorder::~LocationRecorder(&LStack_48);
    if (!bVar3) {
      return false;
    }
    bVar3 = TryConsume(this,",");
    if (!bVar3) {
      bVar3 = ConsumeEndOfDeclaration(this,";",parent_location);
      return bVar3;
    }
  } while( true );
}

Assistant:

bool Parser::ParseReservedNames(EnumDescriptorProto* message,
                                const LocationRecorder& parent_location) {
  do {
    LocationRecorder location(parent_location, message->reserved_name_size());
    DO(ConsumeString(message->add_reserved_name(), "Expected enum value."));
  } while (TryConsume(","));
  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}